

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O1

boolean_format_info * __thiscall
toml::basic_value<toml::type_config>::as_boolean_fmt(basic_value<toml::type_config> *this)

{
  string local_38;
  
  if (this->type_ == boolean) {
    return (boolean_format_info *)((long)&this->field_1 + 1);
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"toml::value::as_boolean_fmt()","");
  throw_bad_cast(this,&local_38,boolean);
}

Assistant:

boolean_format_info const& as_boolean_fmt() const
    {
        if(this->type_ != value_t::boolean)
        {
            this->throw_bad_cast("toml::value::as_boolean_fmt()", value_t::boolean);
        }
        return this->boolean_.format;
    }